

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_TestShell::
TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_TestShell
          (TEST_MemoryReporterPlugin_newArrayAllocationsAreReportedTest_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_002b9000;
  return;
}

Assistant:

TEST(MemoryReporterPlugin, newArrayAllocationsAreReportedTest)
{
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getNewArrayAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentNewArrayAllocator()->allocMemoryLeakNode(100);
    getCurrentNewArrayAllocator()->free_memory(memory, 100, "unknown", 1);
}